

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsClutch.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsClutch::ArchiveIN(ChShaftsClutch *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsClutch>(marchive);
  ChArchiveIn::VersionRead<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveIN((ChPhysicsItem *)this,marchive);
  local_30 = &this->maxT;
  local_38 = "maxT";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->minT;
  local_38 = "minT";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->modulation;
  local_38 = "modulation";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsClutch::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsClutch>();

    // deserialize parent class:
    ChShaftsCouple::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(maxT);
    marchive >> CHNVP(minT);
    marchive >> CHNVP(modulation);
}